

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O2

void __thiscall
google::protobuf::io::Printer::Annotate<google::protobuf::OneofDescriptor>
          (Printer *this,string_view begin_varname,string_view end_varname,
          OneofDescriptor *descriptor,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  string *psVar1;
  string_view file_path;
  vector<int,_std::allocator<int>_> path;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    OneofDescriptor::GetLocationPath(descriptor,(vector<int,_std::allocator<int>_> *)&local_48);
    psVar1 = descriptor->containing_type_->file_->name_;
    file_path._M_str = (psVar1->_M_dataplus)._M_p;
    file_path._M_len = psVar1->_M_string_length;
    Annotate(this,begin_varname,end_varname,file_path,(vector<int,_std::allocator<int>_> *)&local_48
             ,semantic);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  }
  return;
}

Assistant:

void Printer::Annotate(absl::string_view begin_varname,
                       absl::string_view end_varname, const Desc* descriptor,
                       absl::optional<AnnotationCollector::Semantic> semantic) {
  if (options_.annotation_collector == nullptr) {
    return;
  }

  std::vector<int> path;
  descriptor->GetLocationPath(&path);
  Annotate(begin_varname, end_varname, descriptor->file()->name(), path,
           semantic);
}